

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QTransform * __thiscall
QGraphicsItemPrivate::genericMapFromSceneTransform
          (QTransform *__return_storage_ptr__,QGraphicsItemPrivate *this,QWidget *viewport)

{
  QGraphicsItem *this_00;
  QGraphicsView *this_01;
  long lVar1;
  qreal *pqVar2;
  QTransform *pQVar3;
  long in_FS_OFFSET;
  byte bVar4;
  QTransform viewportTransform;
  QTransform QStack_118;
  bool local_c8 [80];
  QTransform local_78;
  long local_28;
  
  bVar4 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)&this->field_0x161 & 0x20000400) != 0) {
    this_00 = this->q_ptr;
    if (viewport == (QWidget *)0x0) {
      this_01 = (QGraphicsView *)0x0;
    }
    else {
      this_01 = (QGraphicsView *)QMetaObject::cast((QObject *)&QGraphicsView::staticMetaObject);
    }
    if (this_01 != (QGraphicsView *)0x0) {
      pqVar2 = (qreal *)&DAT_00700eb8;
      pQVar3 = &local_78;
      for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
        pQVar3->m_matrix[0][0] = *pqVar2;
        pqVar2 = pqVar2 + (ulong)bVar4 * -2 + 1;
        pQVar3 = (QTransform *)((long)pQVar3 + ((ulong)bVar4 * -2 + 1) * 8);
      }
      QGraphicsView::viewportTransform(&local_78,this_01);
      QGraphicsItem::deviceTransform(&QStack_118,this_00,&local_78);
      QTransform::inverted(local_c8);
      QTransform::operator*(__return_storage_ptr__,&local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return __return_storage_ptr__;
      }
      goto LAB_005e3598;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QTransform::inverted((bool *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
LAB_005e3598:
  __stack_chk_fail();
}

Assistant:

QTransform QGraphicsItemPrivate::genericMapFromSceneTransform(const QWidget *viewport) const
{
    Q_Q(const QGraphicsItem);
    if (!itemIsUntransformable())
       return sceneTransform.inverted();
    const QGraphicsView *view = viewport
        ? qobject_cast<QGraphicsView *>(viewport->parentWidget())
        : nullptr;
    if (view == nullptr)
        return sceneTransform.inverted();
    // ### More ping pong than needed.
    const QTransform viewportTransform = view->viewportTransform();
    return viewportTransform * q->deviceTransform(viewportTransform).inverted();
}